

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

ulong __thiscall nuraft::buffer::get_ulong(buffer *this)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *this_00;
  byte *pbVar3;
  buffer *in_RDI;
  ulong byte_val;
  size_t i;
  ulong val;
  byte *d;
  size_t avail;
  ulong local_38;
  ulong local_30;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < 8) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer available for an ulong value");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar3 = data(in_RDI);
  local_30 = 0;
  for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
    local_30 = ((ulong)pbVar3[local_38] << ((byte)(local_38 << 3) & 0x3f)) + local_30;
  }
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + 8;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 8;
  }
  return local_30;
}

Assistant:

ulong buffer::get_ulong() {
    size_t avail = size() - pos();
    if (avail < sz_ulong) {
        throw std::overflow_error
              ( "insufficient buffer available for an ulong value" );
    }

    byte* d = data();
    ulong val = 0L;
    for (size_t i = 0; i < sz_ulong; ++i) {
        ulong byte_val = (ulong)*(d + i);
        val += (byte_val << (i * 8));
    }

    __mv_fw_block(this, sz_ulong);
    return val;
}